

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<unsigned_long>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long *puVar3;
  Optional<unsigned_long> OVar4;
  _Storage<unsigned_long,_true> local_38;
  Optional<unsigned_long> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  opt.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_4_ = indent;
  opt.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._15_1_ = fixed;
  if (fixed) {
    uVar2 = Struct::GetField<unsigned_long>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<unsigned_long>
              (this,uVar2,&(fd->value).type,
               opt.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._8_4_);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      OVar4 = Table::GetOptional<unsigned_long,unsigned_long>(table,(fd->value).offset);
      local_38._M_value =
           OVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      opt.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
           OVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
      if (bVar1) {
        puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_38);
        PrintScalar<unsigned_long>
                  (this,*puVar3,&(fd->value).type,
                   opt.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._8_4_);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      uVar2 = GetFieldDefault<unsigned_long>(fd);
      uVar2 = Table::GetField<unsigned_long>(table,field,uVar2);
      PrintScalar<unsigned_long>
                (this,uVar2,&(fd->value).type,
                 opt.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._8_4_);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }